

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O1

WebPDecBuffer * WebPIDecodedArea(WebPIDecoder *idec,int *left,int *top,int *width,int *height)

{
  WebPDecBuffer *pWVar1;
  int iVar2;
  
  if ((((idec == (WebPIDecoder *)0x0) || (idec->dec == (void *)0x0)) ||
      (idec->state < STATE_VP8_DATA)) || (idec->final_output != (WebPDecBuffer *)0x0)) {
    pWVar1 = (WebPDecBuffer *)0x0;
  }
  else {
    pWVar1 = (idec->params).output;
  }
  if (left != (int *)0x0) {
    *left = 0;
  }
  if (top != (int *)0x0) {
    *top = 0;
  }
  if (pWVar1 == (WebPDecBuffer *)0x0) {
    if (width != (int *)0x0) {
      *width = 0;
    }
    iVar2 = 0;
    if (height == (int *)0x0) {
      return (WebPDecBuffer *)0x0;
    }
  }
  else {
    if (width != (int *)0x0) {
      *width = pWVar1->width;
    }
    if (height == (int *)0x0) {
      return pWVar1;
    }
    iVar2 = (idec->params).last_y;
  }
  *height = iVar2;
  return pWVar1;
}

Assistant:

const WebPDecBuffer* WebPIDecodedArea(const WebPIDecoder* idec,
                                      int* left, int* top,
                                      int* width, int* height) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (left != NULL) *left = 0;
  if (top != NULL) *top = 0;
  if (src != NULL) {
    if (width != NULL) *width = src->width;
    if (height != NULL) *height = idec->params.last_y;
  } else {
    if (width != NULL) *width = 0;
    if (height != NULL) *height = 0;
  }
  return src;
}